

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

rb_node * rb_remove(rb_node **rbt,rb_node *rbn)

{
  rb_node *prVar1;
  rb_node *tmp;
  uint8_t color;
  rb_node *old;
  rb_node *parent;
  rb_node *child;
  rb_node *rbn_local;
  rb_node **rbt_local;
  
  if (rbn->left == (rb_node *)0x0) {
    parent = rbn->right;
  }
  else {
    if (rbn->right != (rb_node *)0x0) {
      prVar1 = rbn->right;
      do {
        child = prVar1;
        prVar1 = child->left;
      } while (child->left != (rb_node *)0x0);
      parent = child->right;
      old = child->parent;
      tmp._7_1_ = child->color;
      if (parent != (rb_node *)0x0) {
        parent->parent = old;
      }
      if (old == (rb_node *)0x0) {
        *rbt = parent;
      }
      else if (old->left == child) {
        old->left = parent;
      }
      else {
        old->right = parent;
      }
      if (child->parent == rbn) {
        old = child;
      }
      child->parent = rbn->parent;
      child->left = rbn->left;
      child->right = rbn->right;
      child->color = rbn->color;
      prVar1 = rbn->parent;
      if (prVar1 == (rb_node *)0x0) {
        *rbt = child;
      }
      else if (prVar1->left == rbn) {
        prVar1->left = child;
      }
      else {
        prVar1->right = child;
      }
      rbn->left->parent = child;
      if (rbn->right != (rb_node *)0x0) {
        rbn->right->parent = child;
      }
      goto LAB_0018bf01;
    }
    parent = rbn->left;
  }
  old = rbn->parent;
  tmp._7_1_ = rbn->color;
  if (parent != (rb_node *)0x0) {
    parent->parent = old;
  }
  if (old == (rb_node *)0x0) {
    *rbt = parent;
  }
  else if (old->left == rbn) {
    old->left = parent;
  }
  else {
    old->right = parent;
  }
LAB_0018bf01:
  if (tmp._7_1_ == '\0') {
    rb_remove_color(rbt,old,parent);
  }
  return rbn;
}

Assistant:

static struct rb_node *
rb_remove(struct rb_node **rbt, struct rb_node *rbn)
{
    struct rb_node *child, *parent, *old = rbn;
    uint8_t color;

    if (RBN_LEFT(rbn) == NULL) {
        child = RBN_RIGHT(rbn);
    } else if (RBN_RIGHT(rbn) == NULL) {
        child = RBN_LEFT(rbn);
    } else {
        struct rb_node *tmp;

        rbn = RBN_RIGHT(rbn);
        while ((tmp = RBN_LEFT(rbn)) != NULL) {
            rbn = tmp;
        }

        child = RBN_RIGHT(rbn);
        parent = RBN_PARENT(rbn);
        color = RBN_COLOR(rbn);
        if (child != NULL) {
            RBN_PARENT(child) = parent;
        }
        if (parent != NULL) {
            if (RBN_LEFT(parent) == rbn) {
                RBN_LEFT(parent) = child;
            } else {
                RBN_RIGHT(parent) = child;
            }
        } else {
            *rbt = child;
        }
        if (RBN_PARENT(rbn) == old) {
            parent = rbn;
        }
        RBN_COPY(rbn, old);

        tmp = RBN_PARENT(old);
        if (tmp != NULL) {
            if (RBN_LEFT(tmp) == old) {
                RBN_LEFT(tmp) = rbn;
            } else {
                RBN_RIGHT(tmp) = rbn;
            }
        } else {
            *rbt = rbn;
        }

        RBN_PARENT(RBN_LEFT(old)) = rbn;
        if (RBN_RIGHT(old)) {
            RBN_PARENT(RBN_RIGHT(old)) = rbn;
        }

        goto color;
    }

    parent = RBN_PARENT(rbn);
    color = RBN_COLOR(rbn);

    if (child != NULL) {
        RBN_PARENT(child) = parent;
    }
    if (parent != NULL) {
        if (RBN_LEFT(parent) == rbn) {
            RBN_LEFT(parent) = child;
        } else {
            RBN_RIGHT(parent) = child;
        }
    } else {
        *rbt = child;
    }
color:
    if (color == RB_BLACK) {
        rb_remove_color(rbt, parent, child);
    }

    return old;
}